

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test4.c
# Opt level: O2

void print_hex(char *s)

{
  char cVar1;
  
  while( true ) {
    while( true ) {
      cVar1 = *s;
      s = s + 1;
      if (cVar1 != ',') break;
      putchar(0x2c);
    }
    if (cVar1 == '\0') break;
    printf("%x ");
  }
  putchar(10);
  return;
}

Assistant:

void print_hex(const char *s)
{
	const char *iter = s;
	unsigned char ch;
	while ((ch = *iter++) != 0)
	{
		if (',' != ch)
			printf("%x ", ch);
		else
			printf(",");
	}
	putchar('\n');
}